

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

CursorType * __thiscall
duckdb::QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<float,_duckdb::QuantileStandardType> *this,WindowPartitionInput *partition)

{
  unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>,_true>
  *this_00;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
  __ptr;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
  this_01;
  type pQVar1;
  pointer __p;
  QuantileCursor<float> *local_20;
  
  this_00 = &this->window_cursor;
  if ((this->window_cursor).
      super_unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
      .super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl ==
      (QuantileCursor<float> *)0x0) {
    this_01.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>)operator_new(0xe0);
    QuantileCursor<float>::QuantileCursor
              ((QuantileCursor<float> *)
               this_01.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl,
               partition);
    local_20 = (QuantileCursor<float> *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
         .super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
    .super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl !=
        (QuantileCursor<float> *)0x0) {
      std::default_delete<duckdb::QuantileCursor<float>_>::operator()
                ((default_delete<duckdb::QuantileCursor<float>_> *)this_00,
                 (QuantileCursor<float> *)
                 __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl);
    }
    if (local_20 != (QuantileCursor<float> *)0x0) {
      std::default_delete<duckdb::QuantileCursor<float>_>::operator()
                ((default_delete<duckdb::QuantileCursor<float>_> *)&local_20,local_20);
    }
  }
  pQVar1 = unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>,_true>
           ::operator*(this_00);
  return pQVar1;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}